

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int ERKStepSStolerances(void *arkode_mem,realtype reltol,realtype abstol)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ERKStep","ERKStepSStolerances",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
  }
  else if (*(int *)((long)arkode_mem + 0x250) == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
    error_code = -0x17;
  }
  else {
    if (0.0 <= reltol) {
      if (0.0 <= abstol) {
        *(uint *)((long)arkode_mem + 0x38) = -(uint)(abstol == 0.0) & 1;
        *(realtype *)((long)arkode_mem + 0x20) = reltol;
        *(realtype *)((long)arkode_mem + 0x28) = abstol;
        *(undefined4 *)((long)arkode_mem + 0x18) = 0;
        *(undefined4 *)((long)arkode_mem + 0x54) = 0;
        *(code **)((long)arkode_mem + 0x58) = arkEwtSetSS;
        *(void **)((long)arkode_mem + 0x60) = arkode_mem;
        return 0;
      }
      msgfmt = "abstol has negative component(s) (illegal).";
    }
    else {
      msgfmt = "reltol < 0 illegal.";
    }
    iVar1 = -0x16;
    error_code = -0x16;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKode","arkSStolerances",msgfmt);
  return iVar1;
}

Assistant:

int ERKStepSStolerances(void *arkode_mem, realtype reltol, realtype abstol)
{
  /* unpack ark_mem, call arkSStolerances, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepSStolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkSStolerances(ark_mem, reltol, abstol));
}